

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::DeleteFromSEL(Clipper *this,TEdge *e)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  TEdge *SelNext;
  TEdge *SelPrev;
  TEdge *e_local;
  Clipper *this_local;
  
  pTVar1 = e->PrevInSEL;
  pTVar2 = e->NextInSEL;
  if (((pTVar1 != (TEdge *)0x0) || (pTVar2 != (TEdge *)0x0)) || (e == this->m_SortedEdges)) {
    if (pTVar1 == (TEdge *)0x0) {
      this->m_SortedEdges = pTVar2;
    }
    else {
      pTVar1->NextInSEL = pTVar2;
    }
    if (pTVar2 != (TEdge *)0x0) {
      pTVar2->PrevInSEL = pTVar1;
    }
    e->NextInSEL = (TEdge *)0x0;
    e->PrevInSEL = (TEdge *)0x0;
  }
  return;
}

Assistant:

void Clipper::DeleteFromSEL(TEdge *e)
{
  TEdge* SelPrev = e->PrevInSEL;
  TEdge* SelNext = e->NextInSEL;
  if( !SelPrev &&  !SelNext && (e != m_SortedEdges) ) return; //already deleted
  if( SelPrev ) SelPrev->NextInSEL = SelNext;
  else m_SortedEdges = SelNext;
  if( SelNext ) SelNext->PrevInSEL = SelPrev;
  e->NextInSEL = 0;
  e->PrevInSEL = 0;
}